

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O3

void innalg(double *vec,int l,int N,double *v,double *theta)

{
  ulong uVar1;
  size_t __n;
  double *acov;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  lVar8 = (long)N;
  acov = (double *)malloc(lVar8 * 8 + 8);
  autocovar(vec,l,acov,N + 1);
  *v = *acov;
  if (-1 < N) {
    uVar1 = lVar8 + 1;
    uVar6 = uVar1 & 0xffffffff;
    __n = uVar6 * 8;
    uVar5 = 0;
    do {
      memset(theta + uVar5,0,__n);
      uVar5 = (ulong)(uint)((int)uVar5 + (int)uVar1);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    if (N != 0) {
      pdVar2 = theta + lVar8 + 2;
      uVar6 = 1;
      do {
        iVar4 = 0;
        uVar5 = 0;
        do {
          if (uVar5 == 0) {
            dVar9 = 0.0;
          }
          else {
            dVar9 = 0.0;
            lVar7 = 0;
            pdVar3 = v;
            do {
              dVar9 = dVar9 + theta[iVar4 + lVar7] * pdVar2[lVar7] * *pdVar3;
              lVar7 = lVar7 + -1;
              pdVar3 = pdVar3 + 1;
            } while (uVar5 + lVar7 != 0);
          }
          theta[uVar6 * (lVar8 + 2) - uVar5] = (acov[uVar6 - uVar5] - dVar9) / v[uVar5];
          uVar5 = uVar5 + 1;
          iVar4 = iVar4 + N + 2;
        } while (uVar5 != uVar6);
        dVar9 = 0.0;
        uVar5 = 0;
        pdVar3 = pdVar2;
        do {
          dVar9 = dVar9 + v[uVar5] * *pdVar3 * *pdVar3;
          uVar5 = uVar5 + 1;
          pdVar3 = pdVar3 + -1;
        } while (uVar6 != uVar5);
        v[uVar6] = *v - dVar9;
        uVar6 = uVar6 + 1;
        pdVar2 = pdVar2 + lVar8 + 2;
      } while (uVar6 != (uVar1 & 0xffffffff));
    }
  }
  free(acov);
  return;
}

Assistant:

void innalg(double *vec, int l, int N,double *v, double *theta) {
	int i,j,lag,ct,ct2,index1,index2;
	double temp,temp2;
	double *acov;
	// IMPORTANT - The program does not store the matrix as laid out
	// in Brockwell and Davis

	// theta is a (N+1)X(N+1) matrix so choose the value of N accordingly. The recommended
	// value is N = 17 which will make theta a 18*18 double vector so allocate memory
	// accordingly.

	// theta11 is accessed at theta[1*(N+1) + 1]

	// with thetaxy accessed at theta[x*(N+1)+y]

	// The coefficients of Moving Average MA(q) are stored at
	// theta[N*(N+1)+1+i] where i = 0,1,2,...,q-1. Multiply these entries by -1.0
	// to get the MA(q) coefficients.

	// Output v is a 1X(N+1) vector with v[0] = autocovariance at lag 0.

	// see ma_inn function below

	lag = N+1;

	acov = (double*) malloc(sizeof(double) * lag);
	autocovar(vec,l,acov,lag);
	//mdisplay(acov,1,lag);
	v[0] = acov[0];

	for(i = 0; i < lag;++i) {
		index1 = i * lag;
		for(j = 0; j < lag;++j) {
			theta[index1+j] = 0.0;
		}
	}

	for(i = 1; i < lag;++i) {
		index1 = i * lag;
		for(j = 0; j < i;++j) {
			index2 = j * lag;
			temp = 0.0;
			for(ct = 0; ct < j;++ct) {
				temp += (theta[index2 + j - ct] * theta[index1 + i - ct]* v[ct]);
			}
			theta[index1 + i - j] = (acov[i-j]-temp)*1.0/v[j];
		}
		temp2 = 0.0;

		for(ct2 = 0; ct2 < i;++ct2) {
			temp2 += (v[ct2]*theta[index1 + i - ct2]*theta[index1 + i - ct2]);
		}

		v[i]=v[0]-temp2;
	}


	free(acov);
}